

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_equal_int(char *file,wchar_t line,longlong v1,char *e1,longlong v2,char *e2,
                           void *extra)

{
  undefined8 in_RCX;
  long in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  long in_R8;
  undefined8 in_R9;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  if (in_RDX != in_R8) {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"%s != %s",in_RCX,in_R9);
    logprintf("      %s=%lld (0x%llx, 0%llo)\n",in_RCX,in_RDX,in_RDX,in_RDX);
    logprintf("      %s=%lld (0x%llx, 0%llo)\n",in_R9,in_R8,in_R8,in_R8);
    failure_finish((void *)0x11b636);
  }
  local_4 = (wchar_t)(in_RDX == in_R8);
  return local_4;
}

Assistant:

int
assertion_equal_int(const char *file, int line,
    long long v1, const char *e1, long long v2, const char *e2, void *extra)
{
	assertion_count(file, line);
	if (v1 == v2)
		return (1);
	failure_start(file, line, "%s != %s", e1, e2);
	logprintf("      %s=%lld (0x%llx, 0%llo)\n", e1, v1, v1, v1);
	logprintf("      %s=%lld (0x%llx, 0%llo)\n", e2, v2, v2, v2);
	failure_finish(extra);
	return (0);
}